

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O3

CURLcode Curl_headers_init(Curl_easy *data)

{
  CURLcode CVar1;
  CURLcode CVar2;
  Curl_cwriter *pCVar3;
  Curl_cwriter *writer;
  Curl_cwriter *local_20;
  
  CVar1 = CURLE_OK;
  if ((data->conn != (connectdata *)0x0) &&
     (CVar1 = CURLE_OK, (data->conn->handler->protocol & 0xc0000003) != 0)) {
    pCVar3 = Curl_cwriter_get_by_name(data,"hds-collect");
    if (pCVar3 == (Curl_cwriter *)0x0) {
      CVar1 = Curl_cwriter_create(&local_20,data,&hds_cw_collect,CURL_CW_PROTOCOL);
      if (CVar1 == CURLE_OK) {
        CVar2 = Curl_cwriter_add(data,local_20);
        CVar1 = CURLE_OK;
        if (CVar2 != CURLE_OK) {
          Curl_cwriter_free(data,local_20);
          CVar1 = CVar2;
        }
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_headers_init(struct Curl_easy *data)
{
  struct Curl_cwriter *writer;
  CURLcode result;

  if(data->conn && (data->conn->handler->protocol & PROTO_FAMILY_HTTP)) {
    /* avoid installing it twice */
    if(Curl_cwriter_get_by_name(data, hds_cw_collect.name))
      return CURLE_OK;

    result = Curl_cwriter_create(&writer, data, &hds_cw_collect,
                                 CURL_CW_PROTOCOL);
    if(result)
      return result;

    result = Curl_cwriter_add(data, writer);
    if(result) {
      Curl_cwriter_free(data, writer);
      return result;
    }
  }
  return CURLE_OK;
}